

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

QSize __thiscall QHeaderView::sectionSizeFromContents(QHeaderView *this,int logicalIndex)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  QHeaderViewPrivate *pQVar3;
  QFont *pQVar4;
  ulong uVar5;
  QStyle *pQVar6;
  undefined4 in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QHeaderViewPrivate *d;
  QFont fnt;
  QStyleOptionHeaderV2 opt;
  QVariant var;
  QVariant variant;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  QSize *in_stack_fffffffffffffe40;
  QVariant *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe68;
  QSize local_188;
  undefined1 local_180 [8];
  QPixmap local_178 [24];
  QIcon local_160;
  QIcon local_158 [4];
  QFontMetrics local_138 [8];
  QFont local_130 [16];
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 local_110 [124];
  undefined4 local_94;
  QVariant local_88;
  QVariant local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *local_30;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QHeaderView *)0x83ffb4);
  QWidget::ensurePolished((QWidget *)CONCAT44(in_ESI,in_stack_fffffffffffffe68));
  local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (pQVar3->super_QAbstractItemViewPrivate).model;
  (**(code **)(*(long *)pQVar1 + 0xa0))(&local_28,pQVar1,in_ESI,pQVar3->orientation,0xd);
  bVar2 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffe40);
  if (bVar2) {
    local_188 = qvariant_cast<QSize>(in_stack_fffffffffffffe48);
  }
  else {
    memset(local_110,0xaa,0x88);
    QStyleOptionHeaderV2::QStyleOptionHeaderV2((QStyleOptionHeaderV2 *)0x840087);
    (**(code **)(*(long *)in_RDI + 0x318))(in_RDI,local_110);
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (pQVar3->super_QAbstractItemViewPrivate).model;
    (**(code **)(*(long *)pQVar1 + 0xa0))(&local_48,pQVar1,in_ESI,pQVar3->orientation,6);
    local_120 = &DAT_aaaaaaaaaaaaaaaa;
    local_118 = &DAT_aaaaaaaaaaaaaaaa;
    QFont::QFont((QFont *)&local_120);
    bVar2 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffe40);
    if ((bVar2) &&
       (bVar2 = ::QVariant::canConvert<QFont>((QVariant *)in_stack_fffffffffffffe40), bVar2)) {
      qvariant_cast<QFont>
                ((QVariant *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      QFont::operator=((QFont *)in_stack_fffffffffffffe40,
                       (QFont *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      QFont::~QFont(local_130);
    }
    else {
      pQVar4 = QWidget::font(in_RDI);
      QFont::operator=((QFont *)&local_120,pQVar4);
    }
    QFont::setBold((QFont *)in_stack_fffffffffffffe40,(bool)in_stack_fffffffffffffe3f);
    QFontMetrics::QFontMetrics(local_138,(QFont *)&local_120);
    QFontMetrics::operator=
              ((QFontMetrics *)in_stack_fffffffffffffe40,
               (QFontMetrics *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
    QFontMetrics::~QFontMetrics(local_138);
    pQVar1 = (pQVar3->super_QAbstractItemViewPrivate).model;
    (**(code **)(*(long *)pQVar1 + 0xa0))(&local_68,pQVar1,in_ESI,pQVar3->orientation,0);
    ::QVariant::toString();
    QString::operator=((QString *)in_stack_fffffffffffffe40,
                       (QString *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
    QString::~QString((QString *)0x840268);
    ::QVariant::~QVariant(&local_68);
    pQVar1 = (pQVar3->super_QAbstractItemViewPrivate).model;
    (**(code **)(*(long *)pQVar1 + 0xa0))(&local_88,pQVar1,in_ESI,pQVar3->orientation,1);
    ::QVariant::operator=(in_stack_fffffffffffffe48,(QVariant *)in_stack_fffffffffffffe40);
    ::QVariant::~QVariant(&local_88);
    qvariant_cast<QIcon>((QVariant *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    QIcon::operator=((QIcon *)in_RDI,(QIcon *)in_stack_fffffffffffffe48);
    QIcon::~QIcon(local_158);
    uVar5 = QIcon::isNull();
    if ((uVar5 & 1) != 0) {
      qvariant_cast<QPixmap>
                ((QVariant *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      QIcon::QIcon(&local_160,(QPixmap *)local_178);
      QIcon::operator=((QIcon *)in_RDI,(QIcon *)in_stack_fffffffffffffe48);
      QIcon::~QIcon(&local_160);
      QPixmap::~QPixmap(local_178);
    }
    bVar2 = isSortIndicatorShown((QHeaderView *)in_stack_fffffffffffffe40);
    if (bVar2) {
      local_94 = 2;
    }
    pQVar6 = QWidget::style((QWidget *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38)
                           );
    QSize::QSize(in_stack_fffffffffffffe40);
    local_188 = (QSize)(**(code **)(*(long *)pQVar6 + 0xe8))(pQVar6,0x13,local_110,local_180,in_RDI)
    ;
    QFont::~QFont((QFont *)&local_120);
    ::QVariant::~QVariant((QVariant *)&local_48);
    QStyleOptionHeaderV2::~QStyleOptionHeaderV2((QStyleOptionHeaderV2 *)0x8403ea);
  }
  ::QVariant::~QVariant((QVariant *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_188;
}

Assistant:

QSize QHeaderView::sectionSizeFromContents(int logicalIndex) const
{
    Q_D(const QHeaderView);
    Q_ASSERT(logicalIndex >= 0);

    ensurePolished();

    // use SizeHintRole
    QVariant variant = d->model->headerData(logicalIndex, d->orientation, Qt::SizeHintRole);
    if (variant.isValid())
        return qvariant_cast<QSize>(variant);

    // otherwise use the contents
    QStyleOptionHeaderV2 opt;
    initStyleOption(&opt);
    opt.section = logicalIndex;
    QVariant var = d->model->headerData(logicalIndex, d->orientation,
                                            Qt::FontRole);
    QFont fnt;
    if (var.isValid() && var.canConvert<QFont>())
        fnt = qvariant_cast<QFont>(var);
    else
        fnt = font();
    fnt.setBold(true);
    opt.fontMetrics = QFontMetrics(fnt);
    opt.text = d->model->headerData(logicalIndex, d->orientation,
                                    Qt::DisplayRole).toString();
    variant = d->model->headerData(logicalIndex, d->orientation, Qt::DecorationRole);
    opt.icon = qvariant_cast<QIcon>(variant);
    if (opt.icon.isNull())
        opt.icon = qvariant_cast<QPixmap>(variant);
    if (isSortIndicatorShown())
        opt.sortIndicator = QStyleOptionHeader::SortDown;
    return style()->sizeFromContents(QStyle::CT_HeaderSection, &opt, QSize(), this);
}